

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::lsd::lsd
          (lsd *this,io_context *ios,lsd_callback *cb,address *listen_address,address *netmask)

{
  undefined8 uVar1;
  long lVar2;
  
  (this->super_enable_shared_from_this<libtorrent::aux::lsd>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<libtorrent::aux::lsd>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_callback = cb;
  (this->m_listen_address).type_ = listen_address->type_;
  (this->m_listen_address).ipv4_address_.addr_.s_addr = (listen_address->ipv4_address_).addr_.s_addr
  ;
  uVar1 = *(undefined8 *)((long)&(listen_address->ipv6_address_).addr_.__in6_u + 8);
  *(undefined8 *)&(this->m_listen_address).ipv6_address_.addr_.__in6_u =
       *(undefined8 *)&(listen_address->ipv6_address_).addr_.__in6_u;
  *(undefined8 *)((long)&(this->m_listen_address).ipv6_address_.addr_.__in6_u + 8) = uVar1;
  (this->m_listen_address).ipv6_address_.scope_id_ = (listen_address->ipv6_address_).scope_id_;
  (this->m_netmask).type_ = netmask->type_;
  (this->m_netmask).ipv4_address_.addr_.s_addr = (netmask->ipv4_address_).addr_.s_addr;
  uVar1 = *(undefined8 *)((long)&(netmask->ipv6_address_).addr_.__in6_u + 8);
  *(undefined8 *)&(this->m_netmask).ipv6_address_.addr_.__in6_u =
       *(undefined8 *)&(netmask->ipv6_address_).addr_.__in6_u;
  *(undefined8 *)((long)&(this->m_netmask).ipv6_address_.addr_.__in6_u + 8) = uVar1;
  (this->m_netmask).ipv6_address_.scope_id_ = (netmask->ipv6_address_).scope_id_;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&this->m_socket,ios,(type *)0x0);
  *(undefined8 *)&(this->m_remote).impl_.data_ = 0;
  *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 0x14) = 0;
  *(undefined8 *)&(this->m_remote).impl_.data_ = 2;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_broadcast_timer).impl_,ios,(type *)0x0);
  lVar2 = random((aux *)0x7fffffff);
  this->m_cookie = ((uint)lVar2 ^ (uint)this) & 0x7fffffff;
  this->m_disabled = false;
  return;
}

Assistant:

lsd::lsd(io_context& ios, aux::lsd_callback& cb
	, address const listen_address, address const netmask)
	: m_callback(cb)
	, m_listen_address(listen_address)
	, m_netmask(netmask)
	, m_socket(ios)
	, m_broadcast_timer(ios)
	, m_cookie((aux::random(0x7fffffff) ^ std::uintptr_t(this)) & 0x7fffffff)
{
}